

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O0

long __thiscall
gl4cts::anon_unknown_0::ImageLoadStoreIncompleteTexturesTest::Run
          (ImageLoadStoreIncompleteTexturesTest *this)

{
  bool bVar1;
  TestContext *pTVar2;
  TestLog *pTVar3;
  MessageBuilder *pMVar4;
  MessageBuilder local_330;
  MessageBuilder local_1a0;
  byte local_19;
  ImageLoadStoreIncompleteTexturesTest *pIStack_18;
  bool result;
  ImageLoadStoreIncompleteTexturesTest *this_local;
  
  local_19 = 1;
  pIStack_18 = this;
  Copy2DRGBA8Textures(this,this->m_complete_destination_texture_id,
                      this->m_incomplete_destination_texture_id,this->m_complete_source_texture_id,
                      this->m_incomplete_source_texture_id);
  glu::CallLogWrapper::glMemoryBarrier
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0xffffffff);
  bVar1 = CheckIfTextureWasModified(this,this->m_incomplete_destination_texture_id,'3');
  if (bVar1) {
    pTVar2 = deqp::Context::getTestContext
                       ((this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                        m_context);
    pTVar3 = tcu::TestContext::getLog(pTVar2);
    tcu::TestLog::operator<<(&local_1a0,pTVar3,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar4 = tcu::MessageBuilder::operator<<
                       (&local_1a0,
                        (char (*) [75])
                        "Problem with imageStore, operation modified contents of incomplete texture"
                       );
    tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1a0);
    local_19 = 0;
  }
  bVar1 = CheckIfTextureIsBlack(this,this->m_complete_destination_texture_id);
  if (!bVar1) {
    pTVar2 = deqp::Context::getTestContext
                       ((this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                        m_context);
    pTVar3 = tcu::TestContext::getLog(pTVar2);
    tcu::TestLog::operator<<(&local_330,pTVar3,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar4 = tcu::MessageBuilder::operator<<
                       (&local_330,
                        (char (*) [79])
                        "Problem with imageLoad, operation returned non 0 result for incomplete texture"
                       );
    tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_330);
    local_19 = 0;
  }
  if ((local_19 & 1) == 0) {
    this_local = (ImageLoadStoreIncompleteTexturesTest *)&DAT_ffffffffffffffff;
  }
  else {
    this_local = (ImageLoadStoreIncompleteTexturesTest *)0x0;
  }
  return (long)this_local;
}

Assistant:

virtual long Run()
	{
		bool result = true;

		/* Copy textures data with imageLoad() and imageStore() operations */
		Copy2DRGBA8Textures(m_complete_destination_texture_id, m_incomplete_destination_texture_id,
							m_complete_source_texture_id, m_incomplete_source_texture_id);

		glMemoryBarrier(GL_ALL_BARRIER_BITS);

		/* Verify that store to "incomplete destination" was ignored */
		if (true ==
			CheckIfTextureWasModified(m_incomplete_destination_texture_id, m_incomplete_destination_magic_number))
		{
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message << "Problem with imageStore, operation modified contents of incomplete texture"
				<< tcu::TestLog::EndMessage;

			result = false;
		}

		/* Verify that load from "incomplete source" returned 0 */
		if (false == CheckIfTextureIsBlack(m_complete_destination_texture_id))
		{
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message
				<< "Problem with imageLoad, operation returned non 0 result for incomplete texture"
				<< tcu::TestLog::EndMessage;

			result = false;
		}

		if (false == result)
		{
			return ERROR;
		}

		/* Done */
		return NO_ERROR;
	}